

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetCurrentExecutableDirectory_abi_cxx11_(void)

{
  reference pvVar1;
  string *psVar2;
  string *in_RDI;
  FilePath local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  undefined1 local_30 [8];
  FilePath argv_0;
  
  internal::GetArgvs_abi_cxx11_();
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_68,0);
  std::__cxx11::string::string((string *)&local_50,(string *)pvVar1);
  internal::FilePath::FilePath((FilePath *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  internal::FilePath::RemoveFileName(&local_98,(FilePath *)local_30);
  psVar2 = internal::FilePath::string_abi_cxx11_(&local_98);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar2);
  internal::FilePath::~FilePath(&local_98);
  internal::FilePath::~FilePath((FilePath *)local_30);
  return in_RDI;
}

Assistant:

static std::string GetCurrentExecutableDirectory() {
  internal::FilePath argv_0(internal::GetArgvs()[0]);
  return argv_0.RemoveFileName().string();
}